

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O2

void __thiscall
Assimp::MD3Importer::InternReadFile
          (MD3Importer *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  string *psVar1;
  float fVar2;
  undefined8 uVar3;
  uint uVar4;
  size_type sVar5;
  bool bVar6;
  uint i;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  long *plVar11;
  aiMesh **__s;
  aiMaterial **__s_00;
  Header *pHVar12;
  aiMesh *paVar13;
  _List_iterator<Assimp::Q3Shader::SkinData::TextureEntry> _Var14;
  Logger *pLVar15;
  _List_iterator<Assimp::Q3Shader::ShaderDataBlock> _Var16;
  aiMaterial *this_00;
  ulong *puVar17;
  aiFace *paVar18;
  aiVector3D *paVar19;
  uint *puVar20;
  aiNode *paVar21;
  aiNode **ppaVar22;
  float *pfVar23;
  DeadlyImportError *pDVar24;
  aiFace *paVar25;
  iterator dit;
  ulong uVar26;
  _List_node_base *p_Var27;
  uint a;
  _Alloc_hider texture_name;
  MD3Importer *this_01;
  aiString *this_02;
  char *pcVar28;
  Surface *pcSurf;
  ShaderDataBlock *shader;
  long lVar29;
  uchar *puVar30;
  uint m;
  ulong uVar31;
  long lVar32;
  _List_node_base *p_Var33;
  uchar *puVar34;
  aiColor3D local_9a0;
  long *local_990;
  char *local_988;
  char *local_980;
  int iMode;
  ulong local_970;
  uchar *local_968;
  uchar *local_960;
  ulong local_958;
  char *local_950;
  char *local_948;
  string convertedPath;
  SkinData skins;
  ShaderData shaders;
  string _texture_name;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  int no_alpha;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  aiString name;
  aiString szString;
  undefined4 extraout_var;
  
  psVar1 = &this->mFile;
  std::__cxx11::string::_M_assign((string *)psVar1);
  this->mScene = pScene;
  this->mIOHandler = pIOHandler;
  std::__cxx11::string::find_last_of((char *)psVar1,0x60b606);
  std::__cxx11::string::substr((ulong)&name,(ulong)psVar1);
  std::__cxx11::string::operator=((string *)&this->filename,(string *)&name);
  std::__cxx11::string::substr((ulong)&szString,(ulong)psVar1);
  std::__cxx11::string::operator=((string *)&this->path,(string *)&szString);
  std::__cxx11::string::~string((string *)&szString);
  std::__cxx11::string::~string((string *)&name);
  pcVar10 = (this->filename)._M_dataplus._M_p;
  for (pcVar28 = pcVar10; pcVar28 != pcVar10 + (this->filename)._M_string_length;
      pcVar28 = pcVar28 + 1) {
    iVar7 = tolower((int)*pcVar28);
    *pcVar28 = (char)iVar7;
    pcVar10 = (this->filename)._M_dataplus._M_p;
  }
  if ((this->configHandleMP == false) || (bVar6 = ReadMultipartFile(this), !bVar6)) {
    std::__cxx11::string::string((string *)&name,"rb",(allocator *)&szString);
    iVar7 = (*pIOHandler->_vptr_IOSystem[4])
                      (pIOHandler,(pFile->_M_dataplus)._M_p,CONCAT44(name.data._0_4_,name.length));
    plVar11 = (long *)CONCAT44(extraout_var,iVar7);
    std::__cxx11::string::~string((string *)&name);
    if (plVar11 == (long *)0x0) {
      pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&szString,
                     "Failed to open MD3 file ",pFile);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&szString,
                     ".");
      DeadlyImportError::DeadlyImportError(pDVar24,(string *)&name);
      __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_990 = plVar11;
    uVar8 = (**(code **)(*plVar11 + 0x30))(plVar11);
    this->fileSize = uVar8;
    if ((uVar8 & 0xfffffffc) < 0x6c) {
      pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&name,"MD3 File is too small.",(allocator *)&szString);
      DeadlyImportError::DeadlyImportError(pDVar24,(string *)&name);
      __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&mBuffer2,(ulong)uVar8,(allocator_type *)&name);
    (**(code **)(*local_990 + 0x10))
              (local_990,
               mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,1,this->fileSize);
    this->mBuffer =
         mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    this->pcHeader =
         (Header *)
         mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    ValidateHeaderOffsets(this);
    pHVar12 = this->pcHeader;
    local_968 = this->mBuffer;
    uVar8 = pHVar12->OFS_SURFACES;
    uVar9 = pHVar12->NUM_SURFACES;
    local_970 = (ulong)pHVar12->OFS_TAGS;
    pScene->mNumMeshes = uVar9;
    uVar4 = this->pcHeader->NUM_SURFACES;
    if (uVar4 == 0) {
      pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&name,"MD3: No surfaces",(allocator *)&szString);
      DeadlyImportError::DeadlyImportError(pDVar24,(string *)&name);
      __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (0x31f38 < uVar4) {
      pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&name,"MD3: Too many surfaces, would run out of memory",
                 (allocator *)&szString);
      DeadlyImportError::DeadlyImportError(pDVar24,(string *)&name);
      __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar26 = (ulong)uVar9 << 3;
    __s = (aiMesh **)operator_new__(uVar26);
    pScene->mMeshes = __s;
    uVar9 = this->pcHeader->NUM_SURFACES;
    pScene->mNumMaterials = uVar9;
    __s_00 = (aiMaterial **)operator_new__(uVar26);
    pScene->mMaterials = __s_00;
    memset(__s,0,uVar26);
    memset(__s_00,0,(ulong)uVar9 << 3);
    skins.textures.
    super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&skins;
    skins.textures.
    super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
    ._M_impl._M_node._M_size = 0;
    skins.textures.
    super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         skins.textures.
         super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    ReadSkin(this,(SkinData *)
                  skins.textures.
                  super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                  ._M_impl._M_node.super__List_node_base._M_next);
    shaders.blocks.
    super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
    ._M_impl._M_node._M_size = 0;
    this_01 = this;
    shaders.blocks.
    super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&shaders;
    shaders.blocks.
    super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&shaders;
    ReadShader(this,&shaders);
    pHVar12 = this->pcHeader;
    local_988 = pHVar12->NAME;
    p_Var27 = shaders.blocks.
              super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (shaders.blocks.
        super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&shaders) {
      for (; p_Var27 != (_List_node_base *)&shaders;
          p_Var27 = (((list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                       *)&p_Var27->_M_next)->
                    super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                    )._M_impl._M_node.super__List_node_base._M_next) {
        ConvertPath(this_01,(char *)p_Var27[1]._M_next,local_988,(string *)(p_Var27 + 1));
        p_Var33 = (_List_node_base *)&p_Var27[3]._M_prev;
        while (p_Var33 = p_Var33->_M_next, p_Var33 != (_List_node_base *)&p_Var27[3]._M_prev) {
          ConvertPath(this_01,(char *)p_Var33[1]._M_next,local_988,(string *)(p_Var33 + 1));
        }
      }
      pHVar12 = this->pcHeader;
    }
    pcSurf = (Surface *)(local_968 + uVar8);
    local_960 = local_968 + local_970;
    local_958 = (ulong)pHVar12->NUM_SURFACES;
    uVar8 = 0;
    while( true ) {
      bVar6 = local_958 == 0;
      local_958 = local_958 - 1;
      if (bVar6) break;
      ValidateSurfaceHeaderOffsets(this,pcSurf);
      if ((pcSurf->NUM_VERTICES == 0) || (pcSurf->NUM_TRIANGLES == 0)) {
        iVar7 = pcSurf->OFS_END;
        pScene->mNumMeshes = pScene->mNumMeshes - 1;
      }
      else {
        local_948 = (char *)(ulong)pcSurf->OFS_XYZNORMAL;
        local_980 = (char *)(ulong)pcSurf->OFS_TRIANGLES;
        uVar9 = pcSurf->OFS_SHADERS;
        local_950 = (char *)(ulong)pcSurf->OFS_ST;
        paVar13 = (aiMesh *)operator_new(0x520);
        aiMesh::aiMesh(paVar13);
        pScene->mMeshes[local_958] = paVar13;
        paVar13 = pScene->mMeshes[local_958];
        _texture_name._M_dataplus._M_p = (pointer)&_texture_name.field_2;
        _texture_name._M_string_length = 0;
        _texture_name.field_2._M_local_buf[0] = '\0';
        this_02 = (aiString *)
                  skins.textures.
                  super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        _Var14 = std::
                 __find_if<std::_List_iterator<Assimp::Q3Shader::SkinData::TextureEntry>,__gnu_cxx::__ops::_Iter_equals_val<char_const[64]>>
                           (skins.textures.
                            super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                            ._M_impl._M_node.super__List_node_base._M_next,&skins);
        if (_Var14._M_node == (_List_node_base *)&skins) {
LAB_0042c806:
          texture_name._M_p = (char *)0x0;
          if (pcSurf->NUM_SHADER != 0) {
            texture_name._M_p = pcSurf->NAME + ((ulong)uVar9 - 4);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)&_texture_name);
          texture_name = _texture_name._M_dataplus;
          pLVar15 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[29]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     (char (*) [29])"MD3: Assigning skin texture ");
          std::operator<<((ostream *)&name,(string *)(_Var14._M_node + 3));
          std::operator<<((ostream *)&name," to surface ");
          std::operator<<((ostream *)&name,pcSurf->NAME);
          std::__cxx11::stringbuf::str();
          Logger::debug(pLVar15,(char *)CONCAT44(szString.data._0_4_,szString.length));
          std::__cxx11::string::~string((string *)&szString);
          this_02 = &name;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_02);
          *(undefined1 *)&_Var14._M_node[5]._M_next = 1;
          if (texture_name._M_p == (pointer)0x0) goto LAB_0042c806;
        }
        convertedPath._M_dataplus._M_p = (pointer)&convertedPath.field_2;
        convertedPath._M_string_length = 0;
        convertedPath.field_2._M_local_buf[0] = '\0';
        if (texture_name._M_p != (char *)0x0) {
          ConvertPath((MD3Importer *)this_02,texture_name._M_p,local_988,&convertedPath);
        }
        if (shaders.blocks.
            super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
            ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&shaders) {
          shader = (ShaderDataBlock *)0x0;
        }
        else {
          std::__cxx11::string::rfind((char)&convertedPath,0x2e);
          std::__cxx11::string::substr((ulong)&name,(ulong)&convertedPath);
          _Var16 = std::
                   __find_if<std::_List_iterator<Assimp::Q3Shader::ShaderDataBlock>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (shaders.blocks.
                              super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                              ._M_impl._M_node.super__List_node_base._M_next,
                              (_List_node_base *)&shaders,&name);
          if (_Var16._M_node == (_List_node_base *)&shaders) {
            pLVar15 = DefaultLogger::get();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &szString,"Unable to find shader record for ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &name);
            Logger::warn(pLVar15,(char *)CONCAT44(szString.data._0_4_,szString.length));
            std::__cxx11::string::~string((string *)&szString);
            shader = (ShaderDataBlock *)0x0;
          }
          else {
            pLVar15 = DefaultLogger::get();
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &szString,"Found shader record for ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &name);
            Logger::info(pLVar15,(char *)CONCAT44(szString.data._0_4_,szString.length));
            shader = (ShaderDataBlock *)(_Var16._M_node + 1);
            std::__cxx11::string::~string((string *)&szString);
          }
          std::__cxx11::string::~string((string *)&name);
        }
        this_00 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_00);
        iMode = 2;
        aiMaterial::AddProperty<int>(this_00,&iMode,1,"$mat.shadingm",0,0);
        local_9a0.r = 0.05;
        local_9a0.g = 0.05;
        local_9a0.b = 0.05;
        aiMaterial::AddProperty<aiColor3D>(this_00,&local_9a0,1,"$clr.ambient",0,0);
        local_9a0.r = 1.0;
        local_9a0.g = 1.0;
        local_9a0.b = 1.0;
        aiMaterial::AddProperty<aiColor3D>(this_00,&local_9a0,1,"$clr.diffuse",0,0);
        aiMaterial::AddProperty<aiColor3D>(this_00,&local_9a0,1,"$clr.specular",0,0);
        name.length = 0;
        name.data._0_4_ = name.data._0_4_ & 0xffffff00;
        memset(name.data + 1,0x1b,0x3ff);
        std::operator+(&local_880,"MD3_[",&this->configSkinFile);
        std::operator+(&local_860,&local_880,"][");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &no_alpha,&local_860,pcSurf->NAME);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &szString,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &no_alpha,"]");
        uVar3 = szString.data._4_8_;
        if ((ulong)szString.data._4_8_ < 0x400) {
          name.length = szString.data._4_4_;
          memcpy(name.data,(void *)CONCAT44(szString.data._0_4_,szString.length),szString.data._4_8_
                );
          name.data[uVar3] = '\0';
        }
        std::__cxx11::string::~string((string *)&szString);
        std::__cxx11::string::~string((string *)&no_alpha);
        std::__cxx11::string::~string((string *)&local_860);
        std::__cxx11::string::~string((string *)&local_880);
        aiMaterial::AddProperty(this_00,&name,"?mat.name",0,0);
        if (shader == (ShaderDataBlock *)0x0) {
          szString.length = 0;
          szString.data._0_4_ = szString.data._0_4_ & 0xffffff00;
          memset(szString.data + 1,0x1b,0x3ff);
          sVar5 = convertedPath._M_string_length;
          if (convertedPath._M_string_length == 0) {
            pLVar15 = DefaultLogger::get();
            Logger::warn(pLVar15,"Texture file name has zero length. Using default name");
            aiString::Set(&szString,"dummy_texture.bmp");
          }
          else if (convertedPath._M_string_length < 0x400) {
            szString.length = (ai_uint32)convertedPath._M_string_length;
            memcpy(szString.data,convertedPath._M_dataplus._M_p,convertedPath._M_string_length);
            szString.data[sVar5] = '\0';
          }
          aiMaterial::AddProperty(this_00,&szString,"$tex.file",1,0);
          no_alpha = 4;
          aiMaterial::AddProperty(this_00,&no_alpha,1,"$tex.flags",1,0);
        }
        else {
          Q3Shader::ConvertShaderToMaterial(this_00,shader);
        }
        pScene->mMaterials[uVar8] = this_00;
        paVar13->mMaterialIndex = uVar8;
        paVar13->mPrimitiveTypes = 4;
        paVar13->mNumVertices = pcSurf->NUM_TRIANGLES * 3;
        uVar26 = (ulong)pcSurf->NUM_TRIANGLES;
        paVar13->mNumFaces = pcSurf->NUM_TRIANGLES;
        puVar17 = (ulong *)operator_new__(uVar26 * 0x10 + 8);
        *puVar17 = uVar26;
        paVar18 = (aiFace *)(puVar17 + 1);
        if (uVar26 != 0) {
          paVar25 = paVar18;
          do {
            paVar25->mNumIndices = 0;
            paVar25->mIndices = (uint *)0x0;
            paVar25 = paVar25 + 1;
          } while (paVar25 != paVar18 + uVar26);
        }
        paVar13->mFaces = paVar18;
        uVar9 = paVar13->mNumVertices;
        uVar26 = (ulong)uVar9 * 0xc;
        paVar19 = (aiVector3D *)operator_new__(uVar26);
        if (uVar9 != 0) {
          uVar26 = uVar26 - 0xc;
          memset(paVar19,0,(uVar26 - uVar26 % 0xc) + 0xc);
        }
        paVar13->mNormals = paVar19;
        uVar9 = paVar13->mNumVertices;
        uVar26 = (ulong)uVar9 * 0xc;
        paVar19 = (aiVector3D *)operator_new__(uVar26);
        if (uVar9 != 0) {
          uVar26 = uVar26 - 0xc;
          memset(paVar19,0,(uVar26 - uVar26 % 0xc) + 0xc);
        }
        paVar13->mVertices = paVar19;
        uVar9 = paVar13->mNumVertices;
        uVar26 = (ulong)uVar9 * 0xc;
        paVar19 = (aiVector3D *)operator_new__(uVar26);
        if (uVar9 != 0) {
          uVar26 = uVar26 - 0xc;
          memset(paVar19,0,(uVar26 - uVar26 % 0xc) + 0xc);
        }
        local_948 = pcSurf->NAME + ((long)local_948 - 4);
        local_980 = pcSurf->NAME + ((long)local_980 - 4);
        local_950 = pcSurf->NAME + ((long)local_950 - 4);
        uVar8 = uVar8 + 1;
        paVar13->mTextureCoords[0] = paVar19;
        paVar13->mNumUVComponents[0] = 2;
        iVar7 = 0;
        for (uVar26 = 0; uVar26 < pcSurf->NUM_TRIANGLES; uVar26 = uVar26 + 1) {
          puVar20 = (uint *)operator_new__(0xc);
          paVar13->mFaces[uVar26].mIndices = puVar20;
          paVar13->mFaces[uVar26].mNumIndices = 3;
          for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
            uVar9 = iVar7 + (int)lVar29;
            paVar13->mFaces[uVar26].mIndices[lVar29] = uVar9;
            uVar31 = (ulong)*(uint *)(local_980 + lVar29 * 4);
            if (pcSurf->NUM_VERTICES <= *(uint *)(local_980 + lVar29 * 4)) {
              pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string
                        ((string *)&szString,"MD3: Invalid vertex index",(allocator *)&no_alpha);
              DeadlyImportError::DeadlyImportError(pDVar24,(string *)&szString);
              __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            paVar19 = paVar13->mVertices;
            paVar19[uVar9].x = (float)(int)*(short *)(local_948 + uVar31 * 8) * 0.015625;
            paVar19[uVar9].y = (float)(int)*(short *)(local_948 + uVar31 * 8 + 2) * 0.015625;
            paVar19[uVar9].z = (float)(int)*(short *)(local_948 + uVar31 * 8 + 4) * 0.015625;
            MD3::LatLngNormalToVec3
                      (*(uint16_t *)(local_948 + uVar31 * 8 + 6),&paVar13->mNormals[uVar9].x);
            paVar13->mTextureCoords[0][uVar9].x = *(float *)(local_950 + uVar31 * 8);
            paVar13->mTextureCoords[0][uVar9].y = 1.0 - *(float *)(local_950 + uVar31 * 8 + 4);
          }
          if ((shader == (ShaderDataBlock *)0x0) || (shader->cull == CULL_CW)) {
            puVar20 = paVar13->mFaces[uVar26].mIndices;
            uVar3 = *(undefined8 *)(puVar20 + 1);
            *(ulong *)(puVar20 + 1) = CONCAT44((int)uVar3,(int)((ulong)uVar3 >> 0x20));
          }
          iVar7 = iVar7 + 3;
          local_980 = local_980 + 0xc;
        }
        iVar7 = pcSurf->OFS_END;
        std::__cxx11::string::~string((string *)&convertedPath);
        std::__cxx11::string::~string((string *)&_texture_name);
      }
      pcSurf = (Surface *)(pcSurf->NAME + (long)iVar7 + -4);
    }
    bVar6 = DefaultLogger::isNullLogger();
    if (!bVar6) {
      p_Var27 = (_List_node_base *)&skins;
      while (p_Var27 = (((list<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                          *)&p_Var27->_M_next)->
                       super__List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                       )._M_impl._M_node.super__List_node_base._M_next,
            p_Var27 != (_List_node_base *)&skins) {
        if (*(char *)(p_Var27 + 5) == '\0') {
          pLVar15 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[27]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                     (char (*) [27])"MD3: Failed to match skin ");
          std::operator<<((ostream *)&name,(string *)(p_Var27 + 1));
          std::operator<<((ostream *)&name," to surface ");
          std::operator<<((ostream *)&name,(string *)(p_Var27 + 3));
          std::__cxx11::stringbuf::str();
          Logger::error(pLVar15,(char *)CONCAT44(szString.data._0_4_,szString.length));
          std::__cxx11::string::~string((string *)&szString);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        }
      }
    }
    if (pScene->mNumMeshes == 0) {
      pDVar24 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&name,"MD3: File contains no valid mesh",(allocator *)&szString);
      DeadlyImportError::DeadlyImportError(pDVar24,(string *)&name);
      __cxa_throw(pDVar24,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pScene->mNumMaterials = uVar8;
    paVar21 = (aiNode *)operator_new(0x478);
    std::__cxx11::string::string((string *)&name,"<MD3Root>",(allocator *)&szString);
    aiNode::aiNode(paVar21,(string *)&name);
    pScene->mRootNode = paVar21;
    std::__cxx11::string::~string((string *)&name);
    uVar8 = pScene->mNumMeshes;
    pScene->mRootNode->mNumMeshes = uVar8;
    puVar20 = (uint *)operator_new__((ulong)uVar8 << 2);
    pScene->mRootNode->mMeshes = puVar20;
    uVar8 = this->pcHeader->NUM_TAGS;
    if (uVar8 != 0) {
      pScene->mRootNode->mNumChildren = uVar8;
      ppaVar22 = (aiNode **)operator_new__((ulong)this->pcHeader->NUM_TAGS << 3);
      pScene->mRootNode->mChildren = ppaVar22;
      puVar34 = local_968 + local_970 + 0x4c;
      for (uVar26 = 0; uVar26 < this->pcHeader->NUM_TAGS; uVar26 = uVar26 + 1) {
        paVar21 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar21);
        puVar30 = local_960;
        pScene->mRootNode->mChildren[uVar26] = paVar21;
        aiString::Set((aiString *)paVar21,(char *)local_960);
        paVar21->mParent = pScene->mRootNode;
        (paVar21->mTransformation).a4 = *(float *)(puVar30 + 0x40);
        (paVar21->mTransformation).b4 = *(float *)(puVar30 + 0x44);
        (paVar21->mTransformation).c4 = *(float *)(puVar30 + 0x48);
        puVar30 = puVar34;
        for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
          for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
            fVar2 = *(float *)(puVar30 + lVar32 * 4);
            pfVar23 = aiMatrix4x4t<float>::operator[](&paVar21->mTransformation,(uint)lVar32);
            pfVar23[lVar29] = fVar2;
          }
          puVar30 = puVar30 + 0xc;
        }
        local_960 = local_960 + 0x70;
        puVar34 = puVar34 + 0x70;
      }
    }
    for (uVar26 = 0; paVar21 = pScene->mRootNode, uVar26 < pScene->mNumMeshes; uVar26 = uVar26 + 1)
    {
      paVar21->mMeshes[uVar26] = (uint)uVar26;
    }
    (paVar21->mTransformation).a1 = 1.0;
    (paVar21->mTransformation).a2 = 0.0;
    (paVar21->mTransformation).a3 = 0.0;
    (paVar21->mTransformation).a4 = 0.0;
    (paVar21->mTransformation).b1 = 0.0;
    (paVar21->mTransformation).b2 = 0.0;
    (paVar21->mTransformation).b3 = 1.0;
    (paVar21->mTransformation).b4 = 0.0;
    (paVar21->mTransformation).c1 = 0.0;
    (paVar21->mTransformation).c2 = -1.0;
    (paVar21->mTransformation).c3 = 0.0;
    (paVar21->mTransformation).c4 = 0.0;
    (paVar21->mTransformation).d1 = 0.0;
    (paVar21->mTransformation).d2 = 0.0;
    (paVar21->mTransformation).d3 = 0.0;
    (paVar21->mTransformation).d4 = 1.0;
    std::__cxx11::
    _List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
    ::_M_clear((_List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                *)&shaders);
    std::__cxx11::
    _List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
    ::_M_clear((_List_base<Assimp::Q3Shader::SkinData::TextureEntry,_std::allocator<Assimp::Q3Shader::SkinData::TextureEntry>_>
                *)&skins);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    (**(code **)(*local_990 + 8))();
  }
  return;
}

Assistant:

void MD3Importer::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    mFile = pFile;
    mScene = pScene;
    mIOHandler = pIOHandler;

    // get base path and file name
    // todo ... move to PathConverter
    std::string::size_type s = mFile.find_last_of("/\\");
    if (s == std::string::npos) {
        s = 0;
    } else {
        ++s;
    }
    filename = mFile.substr(s), path = mFile.substr(0, s);
    for (std::string::iterator it = filename.begin(); it != filename.end(); ++it) {
        *it = static_cast<char>( tolower(*it) );
    }

    // Load multi-part model file, if necessary
    if (configHandleMP) {
        if (ReadMultipartFile())
            return;
    }

    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MD3 file " + pFile + ".");

    // Check whether the md3 file is large enough to contain the header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MD3::Header))
        throw DeadlyImportError( "MD3 File is too small.");

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector<unsigned char> mBuffer2 (fileSize);
    file->Read( &mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];

    pcHeader = (BE_NCONST MD3::Header*)mBuffer;

    // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

    AI_SWAP4(pcHeader->VERSION);
    AI_SWAP4(pcHeader->FLAGS);
    AI_SWAP4(pcHeader->IDENT);
    AI_SWAP4(pcHeader->NUM_FRAMES);
    AI_SWAP4(pcHeader->NUM_SKINS);
    AI_SWAP4(pcHeader->NUM_SURFACES);
    AI_SWAP4(pcHeader->NUM_TAGS);
    AI_SWAP4(pcHeader->OFS_EOF);
    AI_SWAP4(pcHeader->OFS_FRAMES);
    AI_SWAP4(pcHeader->OFS_SURFACES);
    AI_SWAP4(pcHeader->OFS_TAGS);

#endif

    // Validate the file header
    ValidateHeaderOffsets();

    // Navigate to the list of surfaces
    BE_NCONST MD3::Surface* pcSurfaces = (BE_NCONST MD3::Surface*)(mBuffer + pcHeader->OFS_SURFACES);

    // Navigate to the list of tags
    BE_NCONST MD3::Tag* pcTags = (BE_NCONST MD3::Tag*)(mBuffer + pcHeader->OFS_TAGS);

    // Allocate output storage
    pScene->mNumMeshes = pcHeader->NUM_SURFACES;
    if (pcHeader->NUM_SURFACES == 0) {
        throw DeadlyImportError("MD3: No surfaces");
    } else if (pcHeader->NUM_SURFACES > AI_MAX_ALLOC(aiMesh)) {
        // We allocate pointers but check against the size of aiMesh
        // since those pointers will eventually have to point to real objects
        throw DeadlyImportError("MD3: Too many surfaces, would run out of memory");
    }
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    pScene->mNumMaterials = pcHeader->NUM_SURFACES;
    pScene->mMaterials = new aiMaterial*[pScene->mNumMeshes];

    // Set arrays to zero to ensue proper destruction if an exception is raised
    ::memset(pScene->mMeshes,0,pScene->mNumMeshes*sizeof(aiMesh*));
    ::memset(pScene->mMaterials,0,pScene->mNumMaterials*sizeof(aiMaterial*));

    // Now read possible skins from .skin file
    Q3Shader::SkinData skins;
    ReadSkin(skins);

    // And check whether we can locate a shader file for this model
    Q3Shader::ShaderData shaders;
    ReadShader(shaders);

    // Adjust all texture paths in the shader
    const char* header_name = pcHeader->NAME;
    if (!shaders.blocks.empty()) {
        for (std::list< Q3Shader::ShaderDataBlock >::iterator dit = shaders.blocks.begin(); dit != shaders.blocks.end(); ++dit) {
            ConvertPath((*dit).name.c_str(),header_name,(*dit).name);

            for (std::list< Q3Shader::ShaderMapBlock >::iterator mit = (*dit).maps.begin(); mit != (*dit).maps.end(); ++mit) {
                ConvertPath((*mit).name.c_str(),header_name,(*mit).name);
            }
        }
    }

    // Read all surfaces from the file
    unsigned int iNum = pcHeader->NUM_SURFACES;
    unsigned int iNumMaterials = 0;
    while (iNum-- > 0)  {

        // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

        AI_SWAP4(pcSurfaces->FLAGS);
        AI_SWAP4(pcSurfaces->IDENT);
        AI_SWAP4(pcSurfaces->NUM_FRAMES);
        AI_SWAP4(pcSurfaces->NUM_SHADER);
        AI_SWAP4(pcSurfaces->NUM_TRIANGLES);
        AI_SWAP4(pcSurfaces->NUM_VERTICES);
        AI_SWAP4(pcSurfaces->OFS_END);
        AI_SWAP4(pcSurfaces->OFS_SHADERS);
        AI_SWAP4(pcSurfaces->OFS_ST);
        AI_SWAP4(pcSurfaces->OFS_TRIANGLES);
        AI_SWAP4(pcSurfaces->OFS_XYZNORMAL);

#endif

        // Validate the surface header
        ValidateSurfaceHeaderOffsets(pcSurfaces);

        // Navigate to the vertex list of the surface
        BE_NCONST MD3::Vertex* pcVertices = (BE_NCONST MD3::Vertex*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_XYZNORMAL);

        // Navigate to the triangle list of the surface
        BE_NCONST MD3::Triangle* pcTriangles = (BE_NCONST MD3::Triangle*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_TRIANGLES);

        // Navigate to the texture coordinate list of the surface
        BE_NCONST MD3::TexCoord* pcUVs = (BE_NCONST MD3::TexCoord*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_ST);

        // Navigate to the shader list of the surface
        BE_NCONST MD3::Shader* pcShaders = (BE_NCONST MD3::Shader*)
            (((uint8_t*)pcSurfaces) + pcSurfaces->OFS_SHADERS);

        // If the submesh is empty ignore it
        if (0 == pcSurfaces->NUM_VERTICES || 0 == pcSurfaces->NUM_TRIANGLES)
        {
            pcSurfaces = (BE_NCONST MD3::Surface*)(((uint8_t*)pcSurfaces) + pcSurfaces->OFS_END);
            pScene->mNumMeshes--;
            continue;
        }

        // Allocate output mesh
        pScene->mMeshes[iNum] = new aiMesh();
        aiMesh* pcMesh = pScene->mMeshes[iNum];

        std::string _texture_name;
        const char* texture_name = NULL;

        // Check whether we have a texture record for this surface in the .skin file
        std::list< Q3Shader::SkinData::TextureEntry >::iterator it = std::find(
            skins.textures.begin(), skins.textures.end(), pcSurfaces->NAME );

        if (it != skins.textures.end()) {
            texture_name = &*( _texture_name = (*it).second).begin();
            ASSIMP_LOG_DEBUG_F("MD3: Assigning skin texture ", (*it).second, " to surface ", pcSurfaces->NAME);
            (*it).resolved = true; // mark entry as resolved
        }

        // Get the first shader (= texture?) assigned to the surface
        if (!texture_name && pcSurfaces->NUM_SHADER)    {
            texture_name = pcShaders->NAME;
        }

        std::string convertedPath;
        if (texture_name) {
            ConvertPath(texture_name,header_name,convertedPath);
        }

        const Q3Shader::ShaderDataBlock* shader = NULL;

        // Now search the current shader for a record with this name (
        // excluding texture file extension)
        if (!shaders.blocks.empty()) {
            std::string::size_type sh = convertedPath.find_last_of('.');
            if (sh == std::string::npos) {
                sh = convertedPath.length();
            }

            const std::string without_ext = convertedPath.substr(0,sh);
            std::list< Q3Shader::ShaderDataBlock >::const_iterator dit = std::find(shaders.blocks.begin(),shaders.blocks.end(),without_ext);
            if (dit != shaders.blocks.end()) {
                // We made it!
                shader = &*dit;
                ASSIMP_LOG_INFO("Found shader record for " +without_ext );
            } else {
                ASSIMP_LOG_WARN("Unable to find shader record for " + without_ext);
            }
        }

        aiMaterial* pcHelper = new aiMaterial();

        const int iMode = (int)aiShadingMode_Gouraud;
        pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        // Add a small ambient color value - Quake 3 seems to have one
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        clr.b = clr.g = clr.r = 1.0f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        // use surface name + skin_name as material name
        aiString name;
        name.Set("MD3_[" + configSkinFile + "][" + pcSurfaces->NAME + "]");
        pcHelper->AddProperty(&name,AI_MATKEY_NAME);

        if (!shader) {
            // Setup dummy texture file name to ensure UV coordinates are kept during postprocessing
            aiString szString;
            if (convertedPath.length()) {
                szString.Set(convertedPath);
            } else    {
                ASSIMP_LOG_WARN("Texture file name has zero length. Using default name");
                szString.Set("dummy_texture.bmp");
            }
            pcHelper->AddProperty(&szString,AI_MATKEY_TEXTURE_DIFFUSE(0));

            // prevent transparency by default
            int no_alpha = aiTextureFlags_IgnoreAlpha;
            pcHelper->AddProperty(&no_alpha,1,AI_MATKEY_TEXFLAGS_DIFFUSE(0));
        } else {
            Q3Shader::ConvertShaderToMaterial(pcHelper,*shader);
        }

        pScene->mMaterials[iNumMaterials] = (aiMaterial*)pcHelper;
        pcMesh->mMaterialIndex = iNumMaterials++;

            // Ensure correct endianness
#ifdef AI_BUILD_BIG_ENDIAN

        for (uint32_t i = 0; i < pcSurfaces->NUM_VERTICES;++i)  {
            AI_SWAP2( pcVertices[i].NORMAL );
            AI_SWAP2( pcVertices[i].X );
            AI_SWAP2( pcVertices[i].Y );
            AI_SWAP2( pcVertices[i].Z );

            AI_SWAP4( pcUVs[i].U );
            AI_SWAP4( pcUVs[i].U );
        }
        for (uint32_t i = 0; i < pcSurfaces->NUM_TRIANGLES;++i) {
            AI_SWAP4(pcTriangles[i].INDEXES[0]);
            AI_SWAP4(pcTriangles[i].INDEXES[1]);
            AI_SWAP4(pcTriangles[i].INDEXES[2]);
        }

#endif

        // Fill mesh information
        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        pcMesh->mNumVertices        = pcSurfaces->NUM_TRIANGLES*3;
        pcMesh->mNumFaces           = pcSurfaces->NUM_TRIANGLES;
        pcMesh->mFaces              = new aiFace[pcSurfaces->NUM_TRIANGLES];
        pcMesh->mNormals            = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mVertices           = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mTextureCoords[0]   = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mNumUVComponents[0] = 2;

        // Fill in all triangles
        unsigned int iCurrent = 0;
        for (unsigned int i = 0; i < (unsigned int)pcSurfaces->NUM_TRIANGLES;++i)   {
            pcMesh->mFaces[i].mIndices = new unsigned int[3];
            pcMesh->mFaces[i].mNumIndices = 3;

            //unsigned int iTemp = iCurrent;
            for (unsigned int c = 0; c < 3;++c,++iCurrent)  {
                pcMesh->mFaces[i].mIndices[c] = iCurrent;

                // Read vertices
                aiVector3D& vec = pcMesh->mVertices[iCurrent];
                uint32_t index = pcTriangles->INDEXES[c];
                if (index >= pcSurfaces->NUM_VERTICES) {
                    throw DeadlyImportError( "MD3: Invalid vertex index");
                }
                vec.x = pcVertices[index].X*AI_MD3_XYZ_SCALE;
                vec.y = pcVertices[index].Y*AI_MD3_XYZ_SCALE;
                vec.z = pcVertices[index].Z*AI_MD3_XYZ_SCALE;

                // Convert the normal vector to uncompressed float3 format
                aiVector3D& nor = pcMesh->mNormals[iCurrent];
                LatLngNormalToVec3(pcVertices[index].NORMAL,(ai_real*)&nor);

                // Read texture coordinates
                pcMesh->mTextureCoords[0][iCurrent].x = pcUVs[index].U;
                pcMesh->mTextureCoords[0][iCurrent].y = 1.0f-pcUVs[index].V;
            }
            // Flip face order if necessary
            if (!shader || shader->cull == Q3Shader::CULL_CW) {
                std::swap(pcMesh->mFaces[i].mIndices[2],pcMesh->mFaces[i].mIndices[1]);
            }
            ++pcTriangles;
        }

        // Go to the next surface
        pcSurfaces = (BE_NCONST MD3::Surface*)(((unsigned char*)pcSurfaces) + pcSurfaces->OFS_END);
    }

    // For debugging purposes: check whether we found matches for all entries in the skins file
    if (!DefaultLogger::isNullLogger()) {
        for (std::list< Q3Shader::SkinData::TextureEntry>::const_iterator it = skins.textures.begin();it != skins.textures.end(); ++it) {
            if (!(*it).resolved) {
                ASSIMP_LOG_ERROR_F("MD3: Failed to match skin ", (*it).first, " to surface ", (*it).second);
            }
        }
    }

    if (!pScene->mNumMeshes) {
        throw DeadlyImportError( "MD3: File contains no valid mesh");
    }
    pScene->mNumMaterials = iNumMaterials;

    // Now we need to generate an empty node graph
    pScene->mRootNode = new aiNode("<MD3Root>");
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    // Attach tiny children for all tags
    if (pcHeader->NUM_TAGS) {
        pScene->mRootNode->mNumChildren = pcHeader->NUM_TAGS;
        pScene->mRootNode->mChildren = new aiNode*[pcHeader->NUM_TAGS];

        for (unsigned int i = 0; i < pcHeader->NUM_TAGS; ++i, ++pcTags) {
            aiNode* nd = pScene->mRootNode->mChildren[i] = new aiNode();
            nd->mName.Set((const char*)pcTags->NAME);
            nd->mParent = pScene->mRootNode;

            AI_SWAP4(pcTags->origin.x);
            AI_SWAP4(pcTags->origin.y);
            AI_SWAP4(pcTags->origin.z);

            // Copy local origin, again flip z,y
            nd->mTransformation.a4 = pcTags->origin.x;
            nd->mTransformation.b4 = pcTags->origin.y;
            nd->mTransformation.c4 = pcTags->origin.z;

            // Copy rest of transformation (need to transpose to match row-order matrix)
            for (unsigned int a = 0; a < 3;++a) {
                for (unsigned int m = 0; m < 3;++m) {
                    nd->mTransformation[m][a] = pcTags->orientation[a][m];
                    AI_SWAP4(nd->mTransformation[m][a]);
                }
            }
        }
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mRootNode->mMeshes[i] = i;

    // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(
        1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,
        0.f,-1.f,0.f,0.f,
        0.f,0.f,0.f,1.f
    );
}